

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O1

void __thiscall gimage::ImageIO::ImageIO(ImageIO *this)

{
  pointer *pppBVar1;
  iterator iVar2;
  BasicImageIO *local_18;
  
  (this->list).super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = (BasicImageIO *)operator_new(8);
  local_18->_vptr_BasicImageIO = (_func_int **)&PTR__BasicImageIO_00163490;
  iVar2._M_current =
       (this->list).
       super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->list).
      super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>::
    _M_realloc_insert<gimage::BasicImageIO*>
              ((vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>> *)this,iVar2,
               &local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppBVar1 = &(this->list).
                super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  local_18 = (BasicImageIO *)operator_new(8);
  local_18->_vptr_BasicImageIO = (_func_int **)&PTR__BasicImageIO_00163530;
  iVar2._M_current =
       (this->list).
       super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->list).
      super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>::
    _M_realloc_insert<gimage::BasicImageIO*>
              ((vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>> *)this,iVar2,
               &local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppBVar1 = &(this->list).
                super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  local_18 = (BasicImageIO *)operator_new(8);
  local_18->_vptr_BasicImageIO = (_func_int **)&PTR__BasicImageIO_001635f0;
  iVar2._M_current =
       (this->list).
       super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->list).
      super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>::
    _M_realloc_insert<gimage::BasicImageIO*>
              ((vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>> *)this,iVar2,
               &local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppBVar1 = &(this->list).
                super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  local_18 = (BasicImageIO *)operator_new(8);
  local_18->_vptr_BasicImageIO = (_func_int **)&PTR__BasicImageIO_00163730;
  iVar2._M_current =
       (this->list).
       super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->list).
      super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>::
    _M_realloc_insert<gimage::BasicImageIO*>
              ((vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>> *)this,iVar2,
               &local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppBVar1 = &(this->list).
                super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  local_18 = (BasicImageIO *)operator_new(8);
  local_18->_vptr_BasicImageIO = (_func_int **)&PTR__BasicImageIO_00163690;
  iVar2._M_current =
       (this->list).
       super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->list).
      super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>>::
    _M_realloc_insert<gimage::BasicImageIO*>
              ((vector<gimage::BasicImageIO*,std::allocator<gimage::BasicImageIO*>> *)this,iVar2,
               &local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppBVar1 = &(this->list).
                super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  return;
}

Assistant:

ImageIO::ImageIO()
{
  list.push_back(new PNMImageIO());
  list.push_back(new RAWImageIO());

#ifdef INCLUDE_GDAL
  list.push_back(new GDALImageIO());
#endif

#ifdef INCLUDE_TIFF
  list.push_back(new TIFFImageIO());
#endif

#ifdef INCLUDE_PNG
  list.push_back(new PNGImageIO());
#endif

#ifdef INCLUDE_JPEG
  list.push_back(new JPEGImageIO());
#endif
}